

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O0

void __thiscall
Inject::context_nesting_inherit_binding::test_method(context_nesting_inherit_binding *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  lazy_ostream *plVar4;
  service *psVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  unique_id local_280;
  undefined8 local_278;
  basic_cstring<const_char> local_270;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_260;
  basic_cstring<const_char> local_238;
  basic_cstring<const_char> local_228;
  undefined1 local_218 [8];
  injected<Inject::service> p2;
  undefined8 local_200;
  basic_cstring<const_char> local_1f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1e8;
  basic_cstring<const_char> local_1c0;
  basic_cstring<const_char> local_1b0;
  undefined1 local_1a0 [8];
  injected<Inject::service> p_1;
  context<0> c_1;
  undefined8 local_118;
  basic_cstring<const_char> local_110;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_100;
  basic_cstring<const_char> local_d8;
  basic_cstring<const_char> local_c8;
  undefined1 local_b8 [8];
  injected<Inject::service> p;
  context<0> c;
  provides<Inject::service> xxx;
  component<Inject::impl1> local_20;
  component<Inject::impl1> xx;
  component<Inject::service> x;
  context_nesting_inherit_binding *this_local;
  
  inject::context<0>::component<Inject::service>::component((component<Inject::service> *)&xx);
  inject::context<0>::component<Inject::impl1>::component(&local_20);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides
            ((provides<Inject::service> *)&c._parent);
  inject::context<0>::context((context<0> *)&p._ptr.pn);
  inject::context<0>::bind<Inject::service,Inject::impl1>((context<0> *)&p._ptr.pn);
  inject::context<0>::injected<Inject::service>::injected((injected<Inject::service> *)local_b8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c8,0xca,&local_d8);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_100,plVar4,(char (*) [1])0x19674c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_110,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    psVar5 = inject::context<0>::injected<Inject::service>::operator->
                       ((injected<Inject::service> *)local_b8);
    iVar3 = (**psVar5->_vptr_service)();
    local_118 = CONCAT44(extraout_var,iVar3);
    c_1._parent = (context<0> *)inject::id_of<Inject::impl1>::id();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_100,&local_110,0xca,1,2,&local_118,"p->id()",&c_1._parent,"id_of<impl1>::id()"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_100);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  inject::context<0>::context((context<0> *)&p_1._ptr.pn);
  inject::context<0>::injected<Inject::service>::injected((injected<Inject::service> *)local_1a0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1b0,0xcf,&local_1c0);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1e8,plVar4,(char (*) [1])0x19674c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    psVar5 = inject::context<0>::injected<Inject::service>::operator->
                       ((injected<Inject::service> *)local_1a0);
    iVar3 = (**psVar5->_vptr_service)();
    local_200 = CONCAT44(extraout_var_00,iVar3);
    p2._ptr.pn.pi_ = (sp_counted_base *)inject::id_of<Inject::impl1>::id();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_1e8,&local_1f8,0xcf,1,2,&local_200,"p->id()",&p2._ptr.pn,"id_of<impl1>::id()")
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  inject::context<0>::injected<Inject::service>::~injected((injected<Inject::service> *)local_1a0);
  inject::context<0>::~context((context<0> *)&p_1._ptr.pn);
  inject::context<0>::injected<Inject::service>::injected((injected<Inject::service> *)local_218);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_228,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_238);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0xd3,&local_238);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_260,plVar4,(char (*) [1])0x19674c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_270,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    psVar5 = inject::context<0>::injected<Inject::service>::operator->
                       ((injected<Inject::service> *)local_218);
    iVar3 = (**psVar5->_vptr_service)();
    local_278 = CONCAT44(extraout_var_01,iVar3);
    local_280 = inject::id_of<Inject::impl1>::id();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_260,&local_270,0xd3,1,2,&local_278,"p2->id()",&local_280,"id_of<impl1>::id()")
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_260);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  inject::context<0>::injected<Inject::service>::~injected((injected<Inject::service> *)local_218);
  inject::context<0>::injected<Inject::service>::~injected((injected<Inject::service> *)local_b8);
  inject::context<0>::~context((context<0> *)&p._ptr.pn);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::~provides
            ((provides<Inject::service> *)&c._parent);
  inject::context<0>::component<Inject::impl1>::~component(&local_20);
  inject::context<0>::component<Inject::service>::~component((component<Inject::service> *)&xx);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(context_nesting_inherit_binding)
{
    context<>::component<service> x;
    context<>::component<impl1> xx;
    context<>::component<impl1>::provides<service> xxx;

    context<> c;
    c.bind<service, impl1>();
    context<>::injected<service> p;
    BOOST_CHECK_EQUAL(p->id(), id_of<impl1>::id());

    {
        context<> c;
        context<>::injected<service> p;
        BOOST_CHECK_EQUAL(p->id(), id_of<impl1>::id());
    }
    
    context<>::injected<service> p2;
    BOOST_CHECK_EQUAL(p2->id(), id_of<impl1>::id());
}